

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

void __thiscall
Js::JavascriptString::CopyVirtual
          (JavascriptString *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *str;
  
  if (buffer == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb52,"(buffer)","buffer");
    if (!bVar2) goto LAB_00bc1fe5;
    *puVar3 = 0;
  }
  if ((this->m_pszValue).ptr != (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb53,"(!this->IsFinalized())","!this->IsFinalized()");
    if (!bVar2) {
LAB_00bc1fe5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  str = GetString(this);
  CopyHelper(buffer,str,this->m_charLength);
  return;
}

Assistant:

void JavascriptString::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(buffer);
        Assert(!this->IsFinalized());   // CopyVirtual should only be called for unfinalized buffers
        CopyHelper(buffer, GetString(), GetLength());
    }